

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

int __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::open
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *__file,int __oflag,...)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  Dictionary *pDVar7;
  ulong uVar8;
  char *__src;
  size_t sVar9;
  char **ppcVar10;
  size_type sVar11;
  reference ppDVar12;
  unsigned_long uVar13;
  undefined8 uVar14;
  int __oflag_00;
  result_type rVar15;
  pair<const_MeCab::Token_*,_unsigned_long> pVar16;
  string tmp;
  size_t size;
  Token *token;
  result_type n_1;
  char *key;
  size_t i_2;
  DictionaryInfo *d_1;
  int i_1;
  Dictionary *d;
  size_t i;
  size_t n;
  scoped_fixed_array<char_*,_8192> dicfile;
  scoped_fixed_array<char,_8192> buf;
  string userdic;
  Dictionary *sysdic;
  string prefix;
  whatlog *in_stack_fffffffffffff9e8;
  Dictionary *in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  Dictionary *in_stack_fffffffffffffa00;
  string *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa18;
  Dictionary *in_stack_fffffffffffffa20;
  char **in_stack_fffffffffffffa28;
  char *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffaa0;
  Param *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  Param *in_stack_fffffffffffffab8;
  wlog local_230;
  string local_228 [32];
  string local_208 [36];
  CharInfo local_1e4;
  pair<const_MeCab::Token_*,_unsigned_long> local_1e0;
  size_t local_1d0;
  Token *local_1c8;
  wlog local_1c0;
  result_type local_1b8;
  char *local_1a8;
  ulong local_1a0;
  mecab_dictionary_info_t *local_198;
  int local_18c;
  wlog local_188;
  wlog local_180;
  wlog local_178;
  Dictionary *local_170;
  ulong local_168;
  ulong local_160;
  scoped_fixed_array<char_*,_8192> local_158;
  scoped_fixed_array<char,_8192> local_140;
  string local_128 [32];
  wlog local_108;
  wlog local_100;
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [32];
  Dictionary *local_b0;
  wlog local_a8;
  int local_9c;
  wlog local_98 [3];
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  ostream *local_18;
  Tokenizer<mecab_node_t,_mecab_path_t> *local_10;
  bool local_1;
  
  local_18 = (ostream *)__file;
  local_10 = this;
  close(this,(int)__file);
  Param::get<std::__cxx11::string>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"unk.dic",&local_79);
  create_filename(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  uVar3 = Dictionary::open(&this->unkdic_,pcVar5,0x2220ef);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if ((uVar3 & 1) == 0) {
    wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    poVar6 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x67);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"unkdic_.open(create_filename (prefix, UNK_DIC_FILE).c_str())");
    poVar6 = std::operator<<(poVar6,"] ");
    pcVar5 = Dictionary::what((Dictionary *)0x1b2bb8);
    poVar6 = std::operator<<(poVar6,pcVar5);
    local_1 = wlog::operator&(local_98,poVar6);
    local_9c = 1;
    goto LAB_001b4273;
  }
  uVar3 = CharProperty::open(&this->property_,(char *)local_18,__oflag_00);
  if ((uVar3 & 1) == 0) {
    wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    poVar6 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x69);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"property_.open(param)");
    poVar6 = std::operator<<(poVar6,"] ");
    pcVar5 = CharProperty::what((CharProperty *)0x1b2d5a);
    poVar6 = std::operator<<(poVar6,pcVar5);
    local_1 = wlog::operator&(&local_a8,poVar6);
    local_9c = 1;
    goto LAB_001b4273;
  }
  pDVar7 = (Dictionary *)operator_new(0x260);
  Dictionary::Dictionary(in_stack_fffffffffffffa20);
  local_b0 = pDVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"sys.dic",&local_f1);
  create_filename(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  uVar3 = Dictionary::open(pDVar7,pcVar5,0x2220ef);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if ((uVar3 & 1) == 0) {
    wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    poVar6 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x6e);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"sysdic->open (create_filename(prefix, SYS_DIC_FILE).c_str())");
    poVar6 = std::operator<<(poVar6,"] ");
    pcVar5 = Dictionary::what((Dictionary *)0x1b3035);
    poVar6 = std::operator<<(poVar6,pcVar5);
    local_1 = wlog::operator&(&local_100,poVar6);
    local_9c = 1;
    goto LAB_001b4273;
  }
  iVar4 = Dictionary::type(local_b0);
  if (iVar4 != 0) {
    wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    poVar6 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x71);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"sysdic->type() == 0");
    poVar6 = std::operator<<(poVar6,"] ");
    poVar6 = std::operator<<(poVar6,"not a system dictionary: ");
    poVar6 = std::operator<<(poVar6,local_38);
    local_1 = wlog::operator&(&local_108,poVar6);
    local_9c = 1;
    goto LAB_001b4273;
  }
  Dictionary::charset(local_b0);
  CharProperty::set_charset
            ((CharProperty *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
  std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::push_back
            ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
             in_stack_fffffffffffffa00,
             (value_type *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  poVar6 = local_18;
  Param::get<std::__cxx11::string>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    scoped_fixed_array<char,_8192>::scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffff9f0);
    scoped_fixed_array<char_*,_8192>::scoped_fixed_array
              ((scoped_fixed_array<char_*,_8192> *)in_stack_fffffffffffff9f0);
    pcVar5 = scoped_fixed_array<char,_8192>::get(&local_140);
    __src = (char *)std::__cxx11::string::c_str();
    sVar9 = scoped_fixed_array<char,_8192>::size(&local_140);
    strncpy(pcVar5,__src,sVar9);
    scoped_fixed_array<char,_8192>::get(&local_140);
    poVar6 = (ostream *)scoped_fixed_array<char_*,_8192>::get(&local_158);
    scoped_fixed_array<char_*,_8192>::size(&local_158);
    local_160 = tokenizeCSV<char**>(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                                    (size_t)in_stack_fffffffffffffa20);
    for (local_168 = 0; local_168 < local_160; local_168 = local_168 + 1) {
      pDVar7 = (Dictionary *)operator_new(0x260);
      Dictionary::Dictionary(in_stack_fffffffffffffa20);
      local_170 = pDVar7;
      ppcVar10 = scoped_fixed_array<char_*,_8192>::operator[](&local_158,local_168);
      uVar3 = Dictionary::open(pDVar7,*ppcVar10,0x2220ef);
      if ((uVar3 & 1) == 0) {
        wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
        poVar6 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7f);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"d->open(dicfile[i])");
        poVar6 = std::operator<<(poVar6,"] ");
        pcVar5 = Dictionary::what((Dictionary *)0x1b35b4);
        poVar6 = std::operator<<(poVar6,pcVar5);
        local_1 = wlog::operator&(&local_178,poVar6);
        local_9c = 1;
        goto LAB_001b3998;
      }
      iVar4 = Dictionary::type(local_170);
      if (iVar4 != 1) {
        wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
        poVar6 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x80);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"d->type() == 1");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"not a user dictionary: ");
        ppcVar10 = scoped_fixed_array<char_*,_8192>::operator[](&local_158,local_168);
        poVar6 = std::operator<<(poVar6,*ppcVar10);
        local_1 = wlog::operator&(&local_180,poVar6);
        local_9c = 1;
        goto LAB_001b3998;
      }
      bVar1 = Dictionary::isCompatible
                        (in_stack_fffffffffffffa00,
                         (Dictionary *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8)
                        );
      if (!bVar1) {
        wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
        poVar6 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x82);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"sysdic->isCompatible(*d)");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"incompatible dictionary: ");
        ppcVar10 = scoped_fixed_array<char_*,_8192>::operator[](&local_158,local_168);
        poVar6 = std::operator<<(poVar6,*ppcVar10);
        local_1 = wlog::operator&(&local_188,poVar6);
        local_9c = 1;
        goto LAB_001b3998;
      }
      poVar6 = (ostream *)&local_170;
      std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::push_back
                ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
                 in_stack_fffffffffffffa00,
                 (value_type *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
    }
    local_9c = 0;
LAB_001b3998:
    scoped_fixed_array<char_*,_8192>::~scoped_fixed_array
              ((scoped_fixed_array<char_*,_8192> *)in_stack_fffffffffffff9f0);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffff9f0);
    if (local_9c == 0) goto LAB_001b39e4;
  }
  else {
LAB_001b39e4:
    this->dictionary_info_ = (DictionaryInfo *)0x0;
    FreeList<mecab_dictionary_info_t>::free(&this->dictionary_info_freelist_,poVar6);
    sVar11 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::size
                       (&this->dic_);
    local_18c = (int)sVar11;
    while (local_18c = local_18c + -1, -1 < local_18c) {
      local_198 = FreeList<mecab_dictionary_info_t>::alloc
                            ((FreeList<mecab_dictionary_info_t> *)in_stack_fffffffffffffa00);
      local_198->next = this->dictionary_info_;
      std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                (&this->dic_,(long)local_18c);
      pcVar5 = Dictionary::filename((Dictionary *)0x1b3a91);
      local_198->filename = pcVar5;
      ppDVar12 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                           (&this->dic_,(long)local_18c);
      pcVar5 = Dictionary::charset(*ppDVar12);
      local_198->charset = pcVar5;
      ppDVar12 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                           (&this->dic_,(long)local_18c);
      sVar9 = Dictionary::size(*ppDVar12);
      local_198->size = (uint)sVar9;
      ppDVar12 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                           (&this->dic_,(long)local_18c);
      sVar9 = Dictionary::lsize(*ppDVar12);
      local_198->lsize = (uint)sVar9;
      ppDVar12 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                           (&this->dic_,(long)local_18c);
      sVar9 = Dictionary::rsize(*ppDVar12);
      local_198->rsize = (uint)sVar9;
      ppDVar12 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                           (&this->dic_,(long)local_18c);
      iVar4 = Dictionary::type(*ppDVar12);
      local_198->type = iVar4;
      ppDVar12 = std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::operator[]
                           (&this->dic_,(long)local_18c);
      uVar2 = Dictionary::version(*ppDVar12);
      local_198->version = uVar2;
      this->dictionary_info_ = local_198;
    }
    std::
    vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
    ::clear((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             *)0x1b3c69);
    local_1a0 = 0;
    while( true ) {
      uVar8 = local_1a0;
      sVar9 = CharProperty::size((CharProperty *)0x1b3c99);
      if (sVar9 <= uVar8) break;
      local_1a8 = CharProperty::name((CharProperty *)in_stack_fffffffffffff9f0,
                                     (size_t)in_stack_fffffffffffff9e8);
      rVar15 = Dictionary::exactMatchSearch
                         (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
      local_1b8.length = rVar15.length;
      local_1b8.value = rVar15.value;
      if (local_1b8.value == -1) {
        wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
        poVar6 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9b);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"n.value != -1");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"cannot find UNK category: ");
        poVar6 = std::operator<<(poVar6,local_1a8);
        local_1 = wlog::operator&(&local_1c0,poVar6);
        local_9c = 1;
        goto LAB_001b4255;
      }
      local_1c8 = Dictionary::token(&this->unkdic_,&local_1b8);
      local_1d0 = Dictionary::token_size(&this->unkdic_,&local_1b8);
      pVar16 = std::make_pair<MeCab::Token_const*&,unsigned_long&>
                         ((Token **)in_stack_fffffffffffff9f0,
                          (unsigned_long *)in_stack_fffffffffffff9e8);
      local_1e0 = pVar16;
      std::
      vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
      ::push_back((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
      local_1a0 = local_1a0 + 1;
    }
    local_1e4 = CharProperty::getCharInfo(&this->property_,0x20);
    this->space_ = local_1e4;
    Param::get<std::__cxx11::string>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    scoped_string::reset_string
              ((scoped_string *)in_stack_fffffffffffffa00,
               (string *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
    std::__cxx11::string::~string(local_208);
    Param::get<std::__cxx11::string>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    scoped_array<char>::reset
              ((scoped_array<char> *)in_stack_fffffffffffffa00,
               (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      scoped_string::reset_string
                ((scoped_string *)in_stack_fffffffffffffa00,
                 (string *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
    }
    pcVar5 = scoped_array<char>::operator*(&(this->bos_feature_).super_scoped_array<char>);
    if (*pcVar5 == '\0') {
      wlog::wlog((wlog *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      poVar6 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                              );
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xab);
      poVar6 = std::operator<<(poVar6,") [");
      poVar6 = std::operator<<(poVar6,"*bos_feature_ != \'\\0\'");
      poVar6 = std::operator<<(poVar6,"] ");
      poVar6 = std::operator<<(poVar6,"bos-feature is undefined in dicrc");
      local_1 = wlog::operator&(&local_230,poVar6);
    }
    else {
      uVar13 = Param::get<unsigned_long>(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      this->max_grouping_size_ = uVar13;
      if (this->max_grouping_size_ == 0) {
        this->max_grouping_size_ = 0x18;
      }
      local_1 = true;
    }
    local_9c = 1;
    std::__cxx11::string::~string(local_228);
  }
LAB_001b4255:
  std::__cxx11::string::~string(local_128);
LAB_001b4273:
  uVar14 = std::__cxx11::string::~string(local_38);
  return (uint)CONCAT71((int7)((ulong)uVar14 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool Tokenizer<N, P>::open(const Param &param) {
  close();

  const std::string prefix = param.template get<std::string>("dicdir");

  CHECK_FALSE(unkdic_.open(create_filename
                                 (prefix, UNK_DIC_FILE).c_str()))
      << unkdic_.what();
  CHECK_FALSE(property_.open(param)) << property_.what();

  Dictionary *sysdic = new Dictionary;

  CHECK_FALSE(sysdic->open
                    (create_filename(prefix, SYS_DIC_FILE).c_str()))
      << sysdic->what();

  CHECK_FALSE(sysdic->type() == 0)
      << "not a system dictionary: " << prefix;

  property_.set_charset(sysdic->charset());
  dic_.push_back(sysdic);

  const std::string userdic = param.template get<std::string>("userdic");
  if (!userdic.empty()) {
    scoped_fixed_array<char, BUF_SIZE> buf;
    scoped_fixed_array<char *, BUF_SIZE> dicfile;
    std::strncpy(buf.get(), userdic.c_str(), buf.size());
    const size_t n = tokenizeCSV(buf.get(), dicfile.get(), dicfile.size());
    for (size_t i = 0; i < n; ++i) {
      Dictionary *d = new Dictionary;
      CHECK_FALSE(d->open(dicfile[i])) << d->what();
      CHECK_FALSE(d->type() == 1)
          << "not a user dictionary: " << dicfile[i];
      CHECK_FALSE(sysdic->isCompatible(*d))
          << "incompatible dictionary: " << dicfile[i];
      dic_.push_back(d);
    }
  }

  dictionary_info_ = 0;
  dictionary_info_freelist_.free();
  for (int i = static_cast<int>(dic_.size() - 1); i >= 0; --i) {
    DictionaryInfo *d = dictionary_info_freelist_.alloc();
    d->next          = dictionary_info_;
    d->filename      = dic_[i]->filename();
    d->charset       = dic_[i]->charset();
    d->size          = dic_[i]->size();
    d->lsize         = dic_[i]->lsize();
    d->rsize         = dic_[i]->rsize();
    d->type          = dic_[i]->type();
    d->version       = dic_[i]->version();
    dictionary_info_ = d;
  }

  unk_tokens_.clear();
  for (size_t i = 0; i < property_.size(); ++i) {
    const char *key = property_.name(i);
    const Dictionary::result_type n = unkdic_.exactMatchSearch(key);
    CHECK_FALSE(n.value != -1) << "cannot find UNK category: " << key;
    const Token *token = unkdic_.token(n);
    size_t size = unkdic_.token_size(n);
    unk_tokens_.push_back(std::make_pair(token, size));
  }

  space_ = property_.getCharInfo(0x20);  // ad-hoc

  bos_feature_.reset_string(param.template get<std::string>("bos-feature"));

  const std::string tmp = param.template get<std::string>("unk-feature");
  unk_feature_.reset(0);
  if (!tmp.empty()) {
    unk_feature_.reset_string(tmp);
  }

  CHECK_FALSE(*bos_feature_ != '\0')
      << "bos-feature is undefined in dicrc";

  max_grouping_size_ = param.template get<size_t>("max-grouping-size");
  if (max_grouping_size_ == 0) {
    max_grouping_size_ = DEFAULT_MAX_GROUPING_SIZE;
  }

  return true;
}